

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string_view bloaty::ReadBytes(size_t bytes,string_view *data)

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  ulong in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> *unaff_retaddr;
  string_view ret;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  if (sVar1 < in_RDI) {
    Throw(in_stack_fffffffffffffff0._0_8_,(int)(in_RDI >> 0x20));
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (unaff_retaddr,in_stack_fffffffffffffff0._8_8_,
                     (size_type)in_stack_fffffffffffffff0._0_8_);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RSI,in_RDI);
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

inline std::string_view ReadBytes(size_t bytes, std::string_view* data) {
  if (data->size() < bytes) {
    THROW("premature EOF reading variable-length DWARF data");
  }
  std::string_view ret = data->substr(0, bytes);
  data->remove_prefix(bytes);
  return ret;
}